

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  FILE *pFVar4;
  char *pcVar5;
  undefined4 in_register_0000003c;
  char *pcVar6;
  long lVar7;
  
  init((EVP_PKEY_CTX *)CONCAT44(in_register_0000003c,argc));
  cur_file = "stdin";
  lVar7 = 1;
  pFVar4 = _stdin;
  do {
    if (argc <= lVar7) {
      if (pFVar4 != (FILE *)0x0) {
        yyrestart((FILE *)pFVar4);
        yyparse();
      }
      return error_state;
    }
    cur_file = argv[lVar7];
    pFVar4 = fopen(cur_file,"r");
    if (pFVar4 == (FILE *)0x0) {
      pcVar5 = argv[lVar7];
      iVar3 = strcmp(pcVar5,"--help");
      if (iVar3 == 0) {
        usage();
        pFVar4 = (FILE *)0x0;
        goto LAB_00104bc3;
      }
      if ((*pcVar5 == '-') && (pcVar5[1] == '\0')) {
        iVar3 = restorestdin();
        if (iVar3 != -1) {
          cur_file = "stdin";
          pFVar4 = _stdin;
          goto LAB_00104bc3;
        }
      }
      else {
        warn("%s",pcVar5);
        if (argc != 2) {
          fputc(10,_stderr);
        }
      }
    }
    else {
LAB_00104bc3:
      yyrestart((FILE *)pFVar4);
      fflush(_stdout);
      fflush(_stderr);
      if (argc != 2) {
        uVar1 = 0x22;
        if (pFVar4 == _stdin) {
          uVar1 = 0x28;
        }
        uVar2 = 0x22;
        if (pFVar4 == _stdin) {
          uVar2 = 0x29;
        }
        pcVar5 = "\x1b[1m";
        if (stdout_in_tty == 0) {
          pcVar5 = "";
        }
        pcVar6 = "\x1b[0m";
        if (stdout_in_tty == 0) {
          pcVar6 = "";
        }
        printf("%sFile name: %c%s%c%s\n",pcVar5,uVar1,cur_file,uVar2,pcVar6);
      }
      yyparse();
      if (error_state == 0) {
        semchecker();
      }
      if (argc != 2) {
        putchar(10);
      }
      if (pFVar4 != _stdin) {
        fclose(pFVar4);
      }
      restart();
    }
    lVar7 = lVar7 + 1;
    pFVar4 = (FILE *)0x0;
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
#if COMPILER_VERSION >= 3
    if (argc < 3)
        usage();
    FILE *infile = fopen(argv[1], "r");
    if (!infile)
        err(EXIT_FAILURE, "%s", argv[1]);
    output_file = argv[2];
    yyrestart(infile);
    yyparse();
    if (!error_state)
        semchecker();
    if (!error_state) {
        genIR();
#if COMPILER_VERSION >= 4
        genCode();
#endif
    }
#else
    init();
    FILE *infile = stdin; /* use stdin if no arg supplied */
    cur_file = "stdin";
    int i;
    for (i = 1; i < argc; i++) {
        cur_file = argv[i];
        if (!(infile = fopen(argv[i], "r"))) {
            if (strcmp(argv[i], "--help") == 0)
                usage();
            else if (strcmp(argv[i], "-") == 0) {
                if (restorestdin() == -1)
                    continue;
                cur_file = "stdin";
                infile = stdin;
            } else {
                warn("%s", argv[i]);
                if (argc != 2) fputc('\n', stderr);
                continue;
            }
        }
        yyrestart(infile);
        fflush(stdout);
        fflush(stderr);
        if (argc != 2) {
            printf("%sFile name: %c%s%c%s\n",
                   stdout_in_tty ? "\033[1m" : "",
                   infile != stdin ? '"' : '(', cur_file,
                   infile != stdin ? '"' : ')',
                   stdout_in_tty ? "\033[0m" : "");
        }
        yyparse();
#if COMPILER_VERSION >= 2
        if (!error_state)
            semchecker();
#endif
        if (argc != 2) putchar('\n');
        if (infile != stdin) fclose(infile);
        infile = NULL;
        restart();
    }
    if (infile) { /* no args, read stdin */
        yyrestart(infile);
        yyparse();
    }
#endif
    return error_state;
}